

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_resolver_error(Curl_easy *data)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = (uint)data->conn->bits & 1;
  pcVar2 = "proxy";
  if (uVar1 == 0) {
    pcVar2 = "host";
  }
  Curl_failf(data,"Could not resolve %s: %s",pcVar2,(data->state).async.hostname);
  return CURLE_COULDNT_RESOLVE_HOST - uVar1;
}

Assistant:

CURLcode Curl_resolver_error(struct Curl_easy *data)
{
  const char *host_or_proxy;
  CURLcode result;

#ifndef CURL_DISABLE_PROXY
  struct connectdata *conn = data->conn;
  if(conn->bits.httpproxy) {
    host_or_proxy = "proxy";
    result = CURLE_COULDNT_RESOLVE_PROXY;
  }
  else
#endif
  {
    host_or_proxy = "host";
    result = CURLE_COULDNT_RESOLVE_HOST;
  }

  failf(data, "Could not resolve %s: %s", host_or_proxy,
        data->state.async.hostname);

  return result;
}